

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

LoopAnalysis * __thiscall
dxil_spv::CFGStructurizer::analyze_loop
          (LoopAnalysis *__return_storage_ptr__,CFGStructurizer *this,CFGNode *node)

{
  pointer *pppCVar1;
  Vector<CFGNode_*> *this_00;
  uint uVar2;
  bool bVar3;
  LoopExitType LVar4;
  CFGNode *other;
  pointer ppCVar5;
  pointer ppCVar6;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var7;
  pointer ppCVar8;
  CFGNode **ppCVar9;
  pointer ppCVar10;
  pointer ppCVar11;
  Vector<CFGNode_*> *__range3;
  iterator iVar12;
  LoopAnalysis *pLVar13;
  pointer ppCVar14;
  pointer ppCVar15;
  __node_base _Var16;
  CFGNode *loop_exit;
  LoopBacktracer tracer;
  LoopMergeTracer merge_tracer;
  CFGNode *local_110;
  LoopAnalysis *local_108;
  LoopAnalysis *local_100;
  LoopAnalysis *local_f8;
  LoopAnalysis *local_f0;
  LoopAnalysis *local_e8;
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_e0;
  LoopMergeTracer local_a8;
  
  memset(__return_storage_ptr__,0,0x90);
  local_e0._M_buckets = &local_e0._M_single_bucket;
  local_e0._M_bucket_count = 1;
  local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e0._M_element_count = 0;
  local_e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0._M_rehash_policy._M_next_resize = 0;
  local_e0._M_single_bucket = (__node_base_ptr)0x0;
  LoopBacktracer::trace_to_parent((LoopBacktracer *)&local_e0,node,node->pred_back_edge);
  local_a8.loop_exits._M_h._M_buckets = &local_a8.loop_exits._M_h._M_single_bucket;
  local_a8.loop_exits._M_h._M_bucket_count = 1;
  local_a8.loop_exits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.loop_exits._M_h._M_element_count = 0;
  local_a8.loop_exits._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.loop_exits._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.loop_exits._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a8.traced_blocks._M_h._M_buckets = &local_a8.traced_blocks._M_h._M_single_bucket;
  local_a8.traced_blocks._M_h._M_bucket_count = 1;
  local_a8.traced_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.traced_blocks._M_h._M_element_count = 0;
  local_a8.traced_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.traced_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.traced_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a8.backtracer = (LoopBacktracer *)&local_e0;
  LoopMergeTracer::trace_from_parent(&local_a8,node);
  if (local_a8.loop_exits._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    local_108 = (LoopAnalysis *)&__return_storage_ptr__->non_dominated_exit;
    local_e8 = (LoopAnalysis *)&__return_storage_ptr__->dominated_continue_exit;
    local_f0 = (LoopAnalysis *)&__return_storage_ptr__->inner_dominated_exit;
    local_f8 = (LoopAnalysis *)&__return_storage_ptr__->dominated_exit;
    local_100 = (LoopAnalysis *)&__return_storage_ptr__->inner_direct_exits;
    _Var16._M_nxt = local_a8.loop_exits._M_h._M_before_begin._M_nxt;
    do {
      local_110 = (CFGNode *)_Var16._M_nxt[1]._M_nxt;
      LVar4 = get_loop_exit_type(this,node,local_110);
      switch(LVar4) {
      case Exit:
        iVar12._M_current =
             (__return_storage_ptr__->direct_exits).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pLVar13 = __return_storage_ptr__;
        if (iVar12._M_current ==
            (__return_storage_ptr__->direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00131507:
          std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
          _M_realloc_insert<dxil_spv::CFGNode*const&>
                    ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                      *)pLVar13,iVar12,&local_110);
        }
        else {
          *iVar12._M_current = local_110;
          pppCVar1 = &(__return_storage_ptr__->direct_exits).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
        break;
      case Merge:
        iVar12._M_current =
             (__return_storage_ptr__->dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pLVar13 = local_f8;
        if (iVar12._M_current ==
            (__return_storage_ptr__->dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00131507;
        *iVar12._M_current = local_110;
        pppCVar1 = &(__return_storage_ptr__->dominated_exit).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
        break;
      case Escape:
        iVar12._M_current =
             (__return_storage_ptr__->non_dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pLVar13 = local_108;
        if (iVar12._M_current ==
            (__return_storage_ptr__->non_dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00131507;
        *iVar12._M_current = local_110;
        pppCVar1 = &(__return_storage_ptr__->non_dominated_exit).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
        break;
      case MergeToInfiniteLoop:
        iVar12._M_current =
             (__return_storage_ptr__->dominated_continue_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pLVar13 = local_e8;
        if (iVar12._M_current ==
            (__return_storage_ptr__->dominated_continue_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00131507;
        *iVar12._M_current = local_110;
        pppCVar1 = &(__return_storage_ptr__->dominated_continue_exit).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
        break;
      case InnerLoopExit:
        iVar12._M_current =
             (__return_storage_ptr__->inner_direct_exits).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pLVar13 = local_100;
        if (iVar12._M_current ==
            (__return_storage_ptr__->inner_direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00131507;
        *iVar12._M_current = local_110;
        pppCVar1 = &(__return_storage_ptr__->inner_direct_exits).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
        break;
      case InnerLoopMerge:
        iVar12._M_current =
             (__return_storage_ptr__->inner_dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pLVar13 = local_f0;
        if (iVar12._M_current ==
            (__return_storage_ptr__->inner_dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00131507;
        *iVar12._M_current = local_110;
        pppCVar1 = &(__return_storage_ptr__->inner_dominated_exit).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt;
    } while (_Var16._M_nxt != (_Hash_node_base *)0x0);
  }
  pLVar13 = (LoopAnalysis *)&__return_storage_ptr__->dominated_continue_exit;
  ppCVar5 = (__return_storage_ptr__->dominated_continue_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar10 = (__return_storage_ptr__->dominated_continue_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar8 = ppCVar5;
  if (ppCVar5 != ppCVar10) {
    local_108 = pLVar13;
LAB_00131542:
    local_110 = *ppCVar5;
    ppCVar8 = (__return_storage_ptr__->dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar6 = (__return_storage_ptr__->dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar8 != ppCVar6) {
      do {
        if ((local_110 == *ppCVar8) ||
           (uVar2 = (*ppCVar8)->forward_post_visit_order,
           ((this->reachability_bitset).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(ulong)(local_110->forward_post_visit_order * this->reachability_stride) +
             (ulong)(uVar2 >> 5)] >> (uVar2 & 0x1f) & 1) != 0)) {
          iVar12._M_current =
               (__return_storage_ptr__->non_dominated_exit).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_001315f3;
        }
        ppCVar8 = ppCVar8 + 1;
      } while (ppCVar8 != ppCVar6);
    }
    ppCVar9 = (__return_storage_ptr__->non_dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar12._M_current =
         (__return_storage_ptr__->non_dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar9 != iVar12._M_current) {
      do {
        if ((local_110 == *ppCVar9) ||
           (uVar2 = (*ppCVar9)->forward_post_visit_order,
           ((this->reachability_bitset).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(ulong)(local_110->forward_post_visit_order * this->reachability_stride) +
             (ulong)(uVar2 >> 5)] >> (uVar2 & 0x1f) & 1) != 0)) goto LAB_001315f3;
        ppCVar9 = ppCVar9 + 1;
      } while (ppCVar9 != iVar12._M_current);
    }
    ppCVar5 = ppCVar5 + 1;
    goto LAB_0013163e;
  }
LAB_00131655:
  if (8 < (ulong)((long)ppCVar5 - (long)ppCVar8)) {
    other = find_common_post_dominator(&pLVar13->direct_exits);
    local_110 = other;
    if ((other == (CFGNode *)0x0) || (bVar3 = CFGNode::dominates(node,other), !bVar3)) {
      std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>>
                ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                 &__return_storage_ptr__->non_dominated_exit,
                 (__return_storage_ptr__->non_dominated_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__return_storage_ptr__->dominated_continue_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->dominated_continue_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      ppCVar5 = (__return_storage_ptr__->dominated_continue_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->dominated_continue_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppCVar5) {
        (__return_storage_ptr__->dominated_continue_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar5;
      }
    }
    else {
      ppCVar9 = (__return_storage_ptr__->dominated_continue_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar12._M_current =
           (__return_storage_ptr__->dominated_continue_exit).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current != ppCVar9) {
        (__return_storage_ptr__->dominated_continue_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar9;
        iVar12._M_current = ppCVar9;
      }
      if (iVar12._M_current ==
          (__return_storage_ptr__->dominated_continue_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
        _M_realloc_insert<dxil_spv::CFGNode*const&>
                  ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                   pLVar13,iVar12,&local_110);
      }
      else {
        *iVar12._M_current = other;
        pppCVar1 = &(__return_storage_ptr__->dominated_continue_exit).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
  }
  ppCVar5 = (__return_storage_ptr__->dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar10 = (__return_storage_ptr__->dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar5 == ppCVar10) {
    ppCVar8 = (__return_storage_ptr__->inner_dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar6 = (__return_storage_ptr__->inner_dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar8 != ppCVar6) {
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar8;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar6;
      ppCVar15 = (__return_storage_ptr__->dominated_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->inner_dominated_exit).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->inner_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar5;
      (__return_storage_ptr__->inner_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar10;
      (__return_storage_ptr__->inner_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar15;
      ppCVar5 = ppCVar8;
      ppCVar10 = ppCVar6;
    }
  }
  ppCVar8 = (__return_storage_ptr__->direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (__return_storage_ptr__->direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar14 = ppCVar6;
  ppCVar15 = ppCVar8;
  if (ppCVar8 == ppCVar6) {
    ppCVar11 = (__return_storage_ptr__->direct_exits).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppCVar15 = (__return_storage_ptr__->inner_direct_exits).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppCVar15;
    ppCVar14 = (__return_storage_ptr__->inner_direct_exits).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar14;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->inner_direct_exits).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->inner_direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppCVar8;
    (__return_storage_ptr__->inner_direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar6;
    (__return_storage_ptr__->inner_direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar11;
  }
  ppCVar6 = ppCVar15;
  ppCVar11 = ppCVar14;
  ppCVar8 = ppCVar5;
  if ((ppCVar5 == ppCVar10) && (ppCVar8 = ppCVar10, ppCVar15 != ppCVar14)) {
    ppCVar8 = (__return_storage_ptr__->direct_exits).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppCVar6 = (__return_storage_ptr__->dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->dominated_exit).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppCVar15;
    (__return_storage_ptr__->dominated_exit).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar14;
    (__return_storage_ptr__->dominated_exit).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar8;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppCVar5;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar10;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar6;
    ppCVar6 = ppCVar5;
    ppCVar11 = ppCVar10;
    ppCVar10 = ppCVar14;
    ppCVar8 = ppCVar15;
  }
  if ((((long)ppCVar11 - (long)ppCVar6 == 8) && (ppCVar8 == ppCVar10)) &&
     (ppCVar8 = ppCVar10,
     (__return_storage_ptr__->non_dominated_exit).
     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
     _M_impl.super__Vector_impl_data._M_start ==
     (__return_storage_ptr__->non_dominated_exit).
     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    bVar3 = CFGNode::dominates(node,*ppCVar6);
    ppCVar8 = (__return_storage_ptr__->direct_exits).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (bVar3) {
      ppCVar5 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppCVar10 = (__return_storage_ptr__->direct_exits).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->direct_exits).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppCVar6 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar15 = (__return_storage_ptr__->dominated_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar8;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar10;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar6;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar15;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar5;
    }
    else {
      ppCVar5 = (__return_storage_ptr__->non_dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppCVar10 = (__return_storage_ptr__->non_dominated_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar6 = (__return_storage_ptr__->non_dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->non_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar8;
      ppCVar8 = (__return_storage_ptr__->direct_exits).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->non_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->direct_exits).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->non_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar8;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar10;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar6;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar5;
      ppCVar10 = (__return_storage_ptr__->dominated_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppCVar8 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (8 < (ulong)((long)ppCVar10 - (long)ppCVar8)) {
    this_00 = &__return_storage_ptr__->dominated_exit;
    local_110 = find_common_post_dominator(this_00);
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                      ((__return_storage_ptr__->dominated_exit).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (__return_storage_ptr__->dominated_exit).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    iVar12._M_current =
         (__return_storage_ptr__->dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var7._M_current != iVar12._M_current) {
      ppCVar9 = (this_00->
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (iVar12._M_current != ppCVar9) {
        (__return_storage_ptr__->dominated_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar9;
        iVar12._M_current = ppCVar9;
      }
      if (iVar12._M_current ==
          (__return_storage_ptr__->dominated_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
        _M_realloc_insert<dxil_spv::CFGNode*const&>
                  ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                   this_00,iVar12,&local_110);
      }
      else {
        *iVar12._M_current = local_110;
        pppCVar1 = &(__return_storage_ptr__->dominated_exit).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
  }
  std::
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a8.traced_blocks._M_h);
  std::
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a8.loop_exits._M_h);
  std::
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_e0);
  return __return_storage_ptr__;
LAB_001315f3:
  if (iVar12._M_current ==
      (__return_storage_ptr__->non_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
    _M_realloc_insert<dxil_spv::CFGNode*const&>
              ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
               &__return_storage_ptr__->non_dominated_exit,iVar12,&local_110);
  }
  else {
    *iVar12._M_current = local_110;
    pppCVar1 = &(__return_storage_ptr__->non_dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  ppCVar8 = ppCVar5 + 1;
  ppCVar10 = (__return_storage_ptr__->dominated_continue_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar8 != ppCVar10) {
    memmove(ppCVar5,ppCVar8,(long)ppCVar10 - (long)ppCVar8);
    ppCVar10 = (__return_storage_ptr__->dominated_continue_exit).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  ppCVar10 = ppCVar10 + -1;
  (__return_storage_ptr__->dominated_continue_exit).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppCVar10;
LAB_0013163e:
  if (ppCVar5 == ppCVar10) goto code_r0x00131647;
  goto LAB_00131542;
code_r0x00131647:
  ppCVar5 = ppCVar10;
  pLVar13 = local_108;
  ppCVar8 = (local_108->direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  goto LAB_00131655;
}

Assistant:

CFGStructurizer::LoopAnalysis CFGStructurizer::analyze_loop(CFGNode *node) const
{
	LoopAnalysis result;

	// Now, we need to figure out which blocks belong in the loop construct.
	// The way to figure out a natural loop is any block which is dominated by loop header
	// and control flow passes to one of the back edges.

	// Unfortunately, it can be ambiguous which block is the merge block for a loop.
	// Ideally, there is a unique block which is the loop exit block, but if there are multiple breaks
	// there are multiple blocks which are not part of the loop construct.

	LoopBacktracer tracer;
	auto *pred = node->pred_back_edge;

	// Back-trace from here.
	// The CFG is reducible, so node must dominate pred.
	// Since node dominates pred, there is no pred chain we can follow without
	// eventually hitting node, and we'll stop traversal there.

	// All nodes which are touched during this traversal must be part of the loop construct.
	tracer.trace_to_parent(node, pred);

	LoopMergeTracer merge_tracer(tracer);
	merge_tracer.trace_from_parent(node);

	for (auto *loop_exit : merge_tracer.loop_exits)
	{
		auto exit_type = get_loop_exit_type(*node, *loop_exit);
		switch (exit_type)
		{
		case LoopExitType::Exit:
			result.direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopExit:
			// It's not an exit for us, but the inner loop.
			result.inner_direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::Merge:
			result.dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopMerge:
			result.inner_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopFalsePositive:
			// In this case, the inner loop can only exit at the loop header,
			// and thus post-dominance analysis will always fail.
			// Ignore this case as it's a false exit.
			break;

		case LoopExitType::Escape:
			result.non_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::MergeToInfiniteLoop:
			result.dominated_continue_exit.push_back(loop_exit);
			break;
		}
	}

	// A dominated continue exit should not be considered as such if it can reach other "normal" exits.
	// In this case, it's just a break.
	auto continue_itr = result.dominated_continue_exit.begin();
	while (continue_itr != result.dominated_continue_exit.end())
	{
		auto *candidate = *continue_itr;
		bool found_candidate = false;
		for (auto *dominated : result.dominated_exit)
		{
			if (query_reachability(*candidate, *dominated))
			{
				result.non_dominated_exit.push_back(candidate);
				continue_itr = result.dominated_continue_exit.erase(continue_itr);
				found_candidate = true;
				break;
			}
		}

		if (!found_candidate)
		{
			for (auto *non_dominated : result.non_dominated_exit)
			{
				if (query_reachability(*candidate, *non_dominated))
				{
					result.non_dominated_exit.push_back(candidate);
					continue_itr = result.dominated_continue_exit.erase(continue_itr);
					found_candidate = true;
					break;
				}
			}
		}

		if (!found_candidate)
			++continue_itr;
	}

	if (result.dominated_continue_exit.size() > 1)
	{
		// If we have multiple continue exit candidates, they better merge into a single clean candidate that we
		// still dominate, otherwise, ignore this case and treat them all as normal Escape nodes.
		auto *common = find_common_post_dominator(result.dominated_continue_exit);
		if (common && node->dominates(common))
		{
			result.dominated_continue_exit.clear();
			result.dominated_continue_exit.push_back(common);
		}
		else
		{
			result.non_dominated_exit.insert(result.non_dominated_exit.end(),
			                                 result.dominated_continue_exit.begin(),
			                                 result.dominated_continue_exit.end());
			result.dominated_continue_exit.clear();
		}
	}

	// If the only merge candidates we have are inner dominated, treat them as true dominated exits.
	if (result.dominated_exit.empty() && !result.inner_dominated_exit.empty())
		std::swap(result.dominated_exit, result.inner_dominated_exit);

	// If there are no direct exists, treat inner direct exists as direct exits.
	if (result.direct_exits.empty())
		std::swap(result.direct_exits, result.inner_direct_exits);

	// A direct exit can be considered a dominated exit if there are no better candidates.
	if (result.dominated_exit.empty() && !result.direct_exits.empty())
		std::swap(result.dominated_exit, result.direct_exits);

	// If we only have one direct exit, consider it our merge block.
	// Pick either Merge or Escape.
	if (result.direct_exits.size() == 1 && result.dominated_exit.empty() && result.non_dominated_exit.empty())
	{
		if (node->dominates(result.direct_exits.front()))
			std::swap(result.dominated_exit, result.direct_exits);
		else
			std::swap(result.non_dominated_exit, result.direct_exits);
	}

	if (result.dominated_exit.size() >= 2)
	{
		// Try to see if we can reduce the number of merge blocks to just 1.
		// This is relevant if we have various "clean" break blocks.
		auto *post_dominator = find_common_post_dominator(result.dominated_exit);
		if (std::find(result.dominated_exit.begin(), result.dominated_exit.end(),
		              post_dominator) != result.dominated_exit.end())
		{
			result.dominated_exit.clear();
			result.dominated_exit.push_back(post_dominator);
		}
	}

	return result;
}